

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::DTDEntityDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  XMLSize_t XVar3;
  DTDEntityDecl *pDVar4;
  DTDEntityDecl *data;
  undefined1 local_38 [8];
  NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl> e;
  XSerializeEngine *serEng_local;
  NameIdPool<xercesc_4_0::DTDEntityDecl> *objToStore_local;
  
  e.fMemoryManager = (MemoryManager *)serEng;
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    pMVar2 = NameIdPool<xercesc_4_0::DTDEntityDecl>::getMemoryManager(objToStore);
    NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl>::NameIdPoolEnumerator
              ((NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl> *)local_38,objToStore,pMVar2);
    pMVar2 = e.fMemoryManager;
    XVar3 = NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl>::size
                      ((NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl> *)local_38);
    XSerializeEngine::operator<<((XSerializeEngine *)pMVar2,(uint)XVar3);
    while (bVar1 = NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl>::hasMoreElements
                             ((NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl> *)local_38), bVar1)
    {
      pDVar4 = NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl>::nextElement
                         ((NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl> *)local_38);
      (*(pDVar4->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable[3])
                (pDVar4,e.fMemoryManager);
    }
    NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl>::~NameIdPoolEnumerator
              ((NameIdPoolEnumerator<xercesc_4_0::DTDEntityDecl> *)local_38);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<DTDEntityDecl>* const objToStore
                                    , XSerializeEngine&                 serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<DTDEntityDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            DTDEntityDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }
}